

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrioExecution.h
# Opt level: O2

void nrg::PrioExecution::push<void(*)()>(Queue *queue,_func_void *fn)

{
  QueueElement elem;
  QueueElement local_68;
  QueueElement local_40;
  
  local_68.prio = 0;
  local_68.id = next()::nxt;
  local_68.what.super__Function_base._M_functor._M_unused._M_object = (_func_void *)0x0;
  local_68.what.super__Function_base._M_functor._8_8_ = 0;
  local_68.what.super__Function_base._M_manager = (_Manager_type)0x0;
  local_68.what._M_invoker = (_Invoker_type)0x0;
  if (fn != (_func_void *)0x0) {
    local_68.what._M_invoker = std::_Function_handler<void_(),_void_(*)()>::_M_invoke;
    local_68.what.super__Function_base._M_manager =
         std::_Function_handler<void_(),_void_(*)()>::_M_manager;
    local_68.what.super__Function_base._M_functor._M_unused._M_function_pointer = fn;
  }
  next()::nxt = next()::nxt + 1;
  QueueElement::QueueElement(&local_40,&local_68);
  std::
  priority_queue<nrg::PrioExecution::QueueElement,_std::vector<nrg::PrioExecution::QueueElement,_std::allocator<nrg::PrioExecution::QueueElement>_>,_std::greater<nrg::PrioExecution::QueueElement>_>
  ::push(queue,&local_40);
  std::_Function_base::~_Function_base(&local_40.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_68.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { 0, next(), std::move(fn) };
        push(queue, std::move(elem));
    }